

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O0

Offset<RootTable>
CreateRootTable(FlatBufferBuilder64 *_fbb,
               Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> far_vector,int32_t a,
               Offset64<flatbuffers::String> far_string,
               Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> big_vector,
               Offset<flatbuffers::String> near_string,
               Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> nested_root,
               Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> far_struct_vector,
               Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> big_struct_vector,
               Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>
               many_vectors,
               Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> forced_aligned_vector)

{
  Offset<RootTable> OVar1;
  undefined1 local_88 [8];
  RootTableBuilder builder_;
  int32_t a_local;
  FlatBufferBuilder64 *_fbb_local;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> forced_aligned_vector_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_> many_vectors_local;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> big_struct_vector_local;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> far_struct_vector_local;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> nested_root_local;
  Offset<flatbuffers::String> near_string_local;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> big_vector_local;
  Offset64<flatbuffers::String> far_string_local;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> far_vector_local;
  
  builder_._12_4_ = a;
  RootTableBuilder::RootTableBuilder((RootTableBuilder *)local_88,_fbb);
  RootTableBuilder::add_forced_aligned_vector((RootTableBuilder *)local_88,forced_aligned_vector);
  RootTableBuilder::add_big_struct_vector((RootTableBuilder *)local_88,big_struct_vector);
  RootTableBuilder::add_nested_root((RootTableBuilder *)local_88,nested_root);
  RootTableBuilder::add_big_vector((RootTableBuilder *)local_88,big_vector);
  RootTableBuilder::add_many_vectors((RootTableBuilder *)local_88,many_vectors);
  RootTableBuilder::add_far_struct_vector((RootTableBuilder *)local_88,far_struct_vector);
  RootTableBuilder::add_near_string((RootTableBuilder *)local_88,near_string);
  RootTableBuilder::add_far_string((RootTableBuilder *)local_88,far_string);
  RootTableBuilder::add_a((RootTableBuilder *)local_88,builder_._12_4_);
  RootTableBuilder::add_far_vector((RootTableBuilder *)local_88,far_vector);
  OVar1 = RootTableBuilder::Finish((RootTableBuilder *)local_88);
  return (Offset<RootTable>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<RootTable> CreateRootTable(
    ::flatbuffers::FlatBufferBuilder64 &_fbb,
    ::flatbuffers::Offset64<::flatbuffers::Vector<uint8_t>> far_vector = 0,
    int32_t a = 0,
    ::flatbuffers::Offset64<::flatbuffers::String> far_string = 0,
    ::flatbuffers::Offset64<::flatbuffers::Vector64<uint8_t>> big_vector = 0,
    ::flatbuffers::Offset<::flatbuffers::String> near_string = 0,
    ::flatbuffers::Offset64<::flatbuffers::Vector64<uint8_t>> nested_root = 0,
    ::flatbuffers::Offset64<::flatbuffers::Vector<const LeafStruct *>> far_struct_vector = 0,
    ::flatbuffers::Offset64<::flatbuffers::Vector64<const LeafStruct *>> big_struct_vector = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<WrapperTable>>> many_vectors = 0,
    ::flatbuffers::Offset64<::flatbuffers::Vector64<uint8_t>> forced_aligned_vector = 0) {
  RootTableBuilder builder_(_fbb);
  builder_.add_forced_aligned_vector(forced_aligned_vector);
  builder_.add_big_struct_vector(big_struct_vector);
  builder_.add_nested_root(nested_root);
  builder_.add_big_vector(big_vector);
  builder_.add_many_vectors(many_vectors);
  builder_.add_far_struct_vector(far_struct_vector);
  builder_.add_near_string(near_string);
  builder_.add_far_string(far_string);
  builder_.add_a(a);
  builder_.add_far_vector(far_vector);
  return builder_.Finish();
}